

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U32 ZDICT_tryMerge(dictItem *table,dictItem elt,U32 eltNbToSkip,void *buffer)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  U32 UVar5;
  U32 UVar6;
  U32 UVar7;
  ulong uVar8;
  dictItem *pdVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  char *ip;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  char *into;
  long *plVar18;
  dictItem *pdVar19;
  
  uVar10 = elt.savings;
  uVar14 = elt._0_8_ >> 0x20;
  uVar13 = elt.length;
  uVar12 = elt.pos;
  uVar17 = uVar13 + uVar12;
  pdVar9 = table + 1;
  pdVar19 = pdVar9;
  for (uVar16 = 1; uVar16 < table->pos; uVar16 = uVar16 + 1) {
    if (eltNbToSkip != uVar16) {
      uVar2 = pdVar19->pos;
      iVar11 = uVar2 - uVar12;
      if (uVar2 <= uVar17 && (uVar12 <= uVar2 && iVar11 != 0)) {
        pdVar19->length = pdVar19->length + iVar11;
        pdVar19->pos = uVar12;
        uVar13 = (uVar13 >> 3) + (int)((uVar10 * iVar11) / uVar14) + pdVar19->savings;
        pdVar19->savings = uVar13;
        UVar6 = pdVar19->pos;
        UVar7 = pdVar19->length;
        uVar14 = 1;
        goto LAB_001b28ec;
      }
    }
    pdVar19 = pdVar19 + 1;
  }
  plVar18 = (long *)((long)buffer + (elt._0_8_ & 0xffffffff) + 1);
  uVar16 = 1;
  do {
    if (table->pos <= uVar16) {
      return 0;
    }
    if (uVar16 != eltNbToSkip) {
      pdVar19 = table + uVar16;
      uVar2 = table[uVar16].pos;
      uVar3 = table[uVar16].length;
      uVar15 = uVar3 + uVar2;
      if (uVar2 < uVar12 && uVar12 <= uVar15) {
        uVar13 = (uVar13 >> 3) + pdVar19->savings;
        pdVar19->savings = uVar13;
        iVar11 = uVar17 - uVar15;
        if (iVar11 != 0 && (int)uVar15 <= (int)uVar17) {
          pdVar19->length = uVar3 + iVar11;
          uVar13 = uVar13 + (int)((uVar10 * iVar11) / uVar14);
          pdVar19->savings = uVar13;
        }
        UVar6 = pdVar19->pos;
        UVar7 = pdVar19->length;
        uVar14 = 1;
        break;
      }
      if (*(long *)((long)buffer + (ulong)uVar2) == *plVar18) {
        uVar8 = 0;
        do {
          if (uVar3 == uVar8) {
            uVar8 = 1;
            if (1 < (int)(uVar13 - uVar3)) {
              uVar8 = (ulong)(uVar13 - uVar3);
            }
            pdVar19->pos = uVar12;
            pdVar19->savings = pdVar19->savings + (int)((uVar10 * uVar8) / uVar14);
            uVar12 = uVar3 + 1;
            if (uVar13 <= uVar3 + 1) {
              uVar12 = uVar13;
            }
            pdVar19->length = uVar12;
            return (U32)uVar16;
          }
          lVar4 = uVar8 + uVar2;
          pcVar1 = (char *)((long)plVar18 + uVar8);
          uVar8 = uVar8 + 1;
        } while (*(char *)((long)buffer + lVar4) == *pcVar1);
      }
    }
    uVar16 = uVar16 + 1;
    pdVar9 = pdVar9 + 1;
  } while( true );
LAB_001b2967:
  if (uVar16 < 2) {
LAB_001b2998:
    table[uVar14].pos = UVar6;
    table[uVar14].length = UVar7;
    table[uVar14].savings = uVar13;
    return (U32)uVar14;
  }
  uVar12 = (int)uVar16 - 1;
  if (uVar13 <= table[uVar12].savings) {
    uVar14 = uVar16 & 0xffffffff;
    goto LAB_001b2998;
  }
  pdVar19 = table + uVar12;
  pdVar9->savings = pdVar19->savings;
  UVar5 = pdVar19->length;
  pdVar9->pos = pdVar19->pos;
  pdVar9->length = UVar5;
  pdVar9 = pdVar9 + -1;
  uVar16 = uVar16 - 1;
  goto LAB_001b2967;
LAB_001b28ec:
  if (uVar16 < 2) {
LAB_001b291d:
    table[uVar14].pos = UVar6;
    table[uVar14].length = UVar7;
    table[uVar14].savings = uVar13;
    return (U32)uVar14;
  }
  uVar12 = (int)uVar16 - 1;
  if (uVar13 <= table[uVar12].savings) {
    uVar14 = uVar16 & 0xffffffff;
    goto LAB_001b291d;
  }
  pdVar9 = table + uVar12;
  pdVar19->savings = pdVar9->savings;
  UVar5 = pdVar9->length;
  pdVar19->pos = pdVar9->pos;
  pdVar19->length = UVar5;
  pdVar19 = pdVar19 + -1;
  uVar16 = uVar16 - 1;
  goto LAB_001b28ec;
}

Assistant:

static U32 ZDICT_tryMerge(dictItem* table, dictItem elt, U32 eltNbToSkip, const void* buffer)
{
    const U32 tableSize = table->pos;
    const U32 eltEnd = elt.pos + elt.length;
    const char* const buf = (const char*) buffer;

    /* tail overlap */
    U32 u; for (u=1; u<tableSize; u++) {
        if (u==eltNbToSkip) continue;
        if ((table[u].pos > elt.pos) && (table[u].pos <= eltEnd)) {  /* overlap, existing > new */
            /* append */
            U32 const addedLength = table[u].pos - elt.pos;
            table[u].length += addedLength;
            table[u].pos = elt.pos;
            table[u].savings += elt.savings * addedLength / elt.length;   /* rough approx */
            table[u].savings += elt.length / 8;    /* rough approx bonus */
            elt = table[u];
            /* sort : improve rank */
            while ((u>1) && (table[u-1].savings < elt.savings))
                table[u] = table[u-1], u--;
            table[u] = elt;
            return u;
    }   }

    /* front overlap */
    for (u=1; u<tableSize; u++) {
        if (u==eltNbToSkip) continue;

        if ((table[u].pos + table[u].length >= elt.pos) && (table[u].pos < elt.pos)) {  /* overlap, existing < new */
            /* append */
            int const addedLength = (int)eltEnd - (int)(table[u].pos + table[u].length);
            table[u].savings += elt.length / 8;    /* rough approx bonus */
            if (addedLength > 0) {   /* otherwise, elt fully included into existing */
                table[u].length += addedLength;
                table[u].savings += elt.savings * addedLength / elt.length;   /* rough approx */
            }
            /* sort : improve rank */
            elt = table[u];
            while ((u>1) && (table[u-1].savings < elt.savings))
                table[u] = table[u-1], u--;
            table[u] = elt;
            return u;
        }

        if (MEM_read64(buf + table[u].pos) == MEM_read64(buf + elt.pos + 1)) {
            if (isIncluded(buf + table[u].pos, buf + elt.pos + 1, table[u].length)) {
                size_t const addedLength = MAX( (int)elt.length - (int)table[u].length , 1 );
                table[u].pos = elt.pos;
                table[u].savings += (U32)(elt.savings * addedLength / elt.length);
                table[u].length = MIN(elt.length, table[u].length + 1);
                return u;
            }
        }
    }

    return 0;
}